

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.hpp
# Opt level: O1

string * format_error<char_const*&,unsigned_long&>
                   (string *__return_storage_ptr__,Options *opt,char *type,SyntaxTree *context_,
                   char *msg,char **args,unsigned_long *args_1)

{
  _Atomic_word *p_Var1;
  int iVar2;
  element_type *peVar3;
  int iVar4;
  uint32_t colno;
  __normal_iterator<const_std::shared_ptr<SyntaxTree>_*,_std::vector<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>_>
  _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  uint32_t lineno;
  uint32_t length;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar7;
  TextStream *this_00;
  bool bVar8;
  pair<unsigned_long,_unsigned_long> pVar9;
  optional<const_TokenStream::TextStream_&> local_50;
  TokenData local_48;
  
  if ((((context_->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) || ((context_->token).begin == (context_->token).end)) &&
     (_Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<SyntaxTree>const*,std::vector<std::shared_ptr<SyntaxTree>,std::allocator<std::shared_ptr<SyntaxTree>>>>,__gnu_cxx::__ops::_Iter_pred<format_error<char_const*&,unsigned_long&>(Options_const&,char_const*,SyntaxTree_const&,char_const*,char_const*&,unsigned_long&)::_lambda(std::shared_ptr<SyntaxTree>const&)_1_>>
                        ((context_->childs).
                         super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (context_->childs).
                         super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish),
     _Var5._M_current !=
     (context_->childs).
     super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>.
     _M_impl.super__Vector_impl_data._M_finish)) {
    context_ = ((_Var5._M_current)->super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
  }
  peVar3 = (context_->instream).
           super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    p_Var6 = (peVar3->tstream).super___weak_ptr<const_TokenStream,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_weak_count = p_Var6->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_weak_count = p_Var6->_M_weak_count + 1;
      }
    }
  }
  if (p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar8 = true;
  }
  else {
    bVar8 = p_Var6->_M_use_count == 0;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var6->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var6->_M_weak_count;
      p_Var6->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var6->_vptr__Sp_counted_base[3])();
    }
  }
  if (bVar8) {
    local_48.type = Command;
    local_48._4_4_ = 0;
    format_error<>(__return_storage_ptr__,opt,"fatal error",
                   (optional<const_TokenStream::TextStream_&> *)&local_48,(char *)0x0,0,0,0,
                   "context->token_stream() == nullptr during format_error");
  }
  else {
    peVar3 = (context_->instream).
             super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 == (element_type *)0x0) {
      peVar7 = (element_type *)0x0;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      peVar7 = (peVar3->tstream).super___weak_ptr<const_TokenStream,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var6 = (peVar3->tstream).super___weak_ptr<const_TokenStream,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_weak_count = p_Var6->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_weak_count = p_Var6->_M_weak_count + 1;
        }
      }
    }
    this = p_Var6;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar4 = p_Var6->_M_use_count;
      do {
        this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (iVar4 == 0) break;
        LOCK();
        iVar2 = p_Var6->_M_use_count;
        bVar8 = iVar4 == iVar2;
        if (bVar8) {
          p_Var6->_M_use_count = iVar4 + 1;
          iVar2 = iVar4;
        }
        iVar4 = iVar2;
        UNLOCK();
        this = p_Var6;
      } while (!bVar8);
    }
    if (this == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      peVar7 = (element_type *)0x0;
    }
    else if (this->_M_use_count == 0) {
      peVar7 = (element_type *)0x0;
    }
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var6->_M_weak_count;
        iVar4 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar4 = p_Var6->_M_weak_count;
        p_Var6->_M_weak_count = iVar4 + -1;
      }
      if (iVar4 == 1) {
        (*p_Var6->_vptr__Sp_counted_base[3])();
      }
    }
    SyntaxTree::get_token(&local_48,context_);
    this_00 = &peVar7->text;
    if (local_48.end == local_48.begin) {
      local_50.ref = (TextStream *)0x0;
      lineno = 0;
      colno = 0;
      length = 0;
    }
    else {
      pVar9 = TokenStream::TextStream::linecol_from_offset(this_00,local_48.begin);
      colno = (uint32_t)pVar9.second;
      lineno = (uint32_t)pVar9.first;
      length = (int)local_48.end - (int)local_48.begin;
      local_50.ref = this_00;
    }
    format_error<char_const*&,unsigned_long&>
              (__return_storage_ptr__,opt,type,&local_50,(this_00->stream_name)._M_dataplus._M_p,
               lineno,colno,length,msg,args,args_1);
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string format_error(const Options& opt, const char* type, const SyntaxTree& context_, const char* msg, Args&&... args)
{
    const SyntaxTree* context = &context_;

    if(!context->has_text())
    {
        auto it = std::find_if(context->begin(), context->end(), [](const shared_ptr<SyntaxTree>& child) {
            return child->has_text();
        });
        context = (it == context->end())? context : it->get();
    }

    if(context->token_stream().use_count() == 0)
    {
        return format_error(opt, "fatal error", nocontext, "context->token_stream() == nullptr during format_error");
    }
    else
    {
        auto tstream = context->token_stream().lock();
        return format_error(opt, type, TokenStream::TokenInfo(tstream->text, context->get_token()), msg, std::forward<Args>(args)...);
    }
}